

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O1

void Json_ReadTest(char *pFileName)

{
  void *__ptr;
  Vec_Wec_t *vObjs;
  long lVar1;
  long lVar2;
  Abc_Nam_t *pStrs;
  Abc_Nam_t *local_20;
  
  vObjs = Json_Read(pFileName,&local_20);
  if (vObjs != (Vec_Wec_t *)0x0) {
    Json_Write("test.json",local_20,vObjs);
    Abc_NamDeref(local_20);
    if (0 < vObjs->nCap) {
      lVar1 = 8;
      lVar2 = 0;
      do {
        __ptr = *(void **)((long)&vObjs->pArray->nCap + lVar1);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&vObjs->pArray->nCap + lVar1) = 0;
        }
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (lVar2 < vObjs->nCap);
    }
    if (vObjs->pArray != (Vec_Int_t *)0x0) {
      free(vObjs->pArray);
      vObjs->pArray = (Vec_Int_t *)0x0;
    }
    vObjs->nCap = 0;
    vObjs->nSize = 0;
    free(vObjs);
    return;
  }
  return;
}

Assistant:

void Json_ReadTest( char * pFileName )
{
    Abc_Nam_t * pStrs;
    Vec_Wec_t * vObjs;
    vObjs = Json_Read( pFileName, &pStrs );
    if ( vObjs == NULL )
        return;
    Json_Write( "test.json", pStrs, vObjs );
    Abc_NamDeref( pStrs );
    Vec_WecFree( vObjs );
}